

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf2.c
# Opt level: O2

bool_t gf2IsOperable(qr_o *f)

{
  ulong *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  bool_t bVar6;
  uint uVar7;
  long lVar9;
  uint uVar8;
  
  bVar6 = qrIsOperable(f);
  uVar7 = 0;
  uVar8 = 0;
  if (bVar6 != 0) {
    bVar6 = memIsValid(f->params,0x20);
    if (bVar6 != 0) {
      puVar1 = (ulong *)f->params;
      uVar2 = *puVar1;
      uVar3 = puVar1[1];
      if (((((uVar3 < uVar2) && (uVar4 = puVar1[2], uVar7 = uVar8, uVar4 <= uVar3)) &&
           (uVar5 = puVar1[3], uVar5 <= uVar4)) &&
          ((uVar4 == 0 || (((uVar5 != 0 && (uVar3 != uVar4)) && (uVar4 != uVar5)))))) &&
         ((f->n == uVar2 + 0x3f >> 6 && (f->no == uVar2 + 7 >> 3)))) {
        lVar9 = f->n + (ulong)((uVar2 & 0x3f) == 0);
        bVar6 = memIsValid(f->mod,lVar9 * 8);
        if (bVar6 != 0) {
          uVar7 = (uint)(f->mod[lVar9 + -1] != 0);
        }
      }
    }
  }
  return uVar7;
}

Assistant:

bool_t gf2IsOperable(const qr_o* f)
{
	const size_t* p;
	size_t n1;
	if (!qrIsOperable(f) || 
		!memIsValid(f->params, 4 * sizeof(size_t)))
		return FALSE;
	// проверить описание многочлена
	p = (size_t*)f->params;
	if (p[0] <= p[1] || p[1] < p[2] || p[2] < p[3] ||
		(p[2] > 0 && (p[1] == p[2] || p[2] == p[3] || p[3] == 0)) ||
		f->n != W_OF_B(p[0]) || f->no != O_OF_B(p[0]))
		return FALSE;
	// проверить модуль
	n1 = f->n + (p[0] % B_PER_W == 0);
	if (!wwIsValid(f->mod, n1) || f->mod[n1 - 1] == 0)
		return FALSE;
	// все нормально
	return TRUE;
}